

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O0

BerdyOptions * __thiscall iDynTree::BerdyHelper::getOptions(BerdyHelper *this)

{
  BerdyOptions *in_RDI;
  BerdyOptions *in_stack_00000010;
  
  BerdyOptions::BerdyOptions(in_stack_00000010,(BerdyOptions *)this);
  return in_RDI;
}

Assistant:

BerdyOptions BerdyHelper::getOptions() const
{
    return m_options;
}